

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanStreamStart(Scanner *this)

{
  EncodingInfo EVar1;
  undefined1 local_78 [8];
  Token T;
  EncodingInfo EI;
  Scanner *this_local;
  
  this->IsStartOfStream = false;
  join_0x00000010_0x00000000_ = currentInput(this);
  EVar1 = getUnicodeEncoding(join_0x00000010_0x00000000_);
  Token::Token((Token *)local_78);
  local_78._0_4_ = TK_StreamStart;
  T._0_8_ = this->Current;
  T.Range.Data = (char *)((ulong)EVar1 >> 0x20);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_78);
  this->Current = this->Current + ((ulong)EVar1 >> 0x20);
  Token::~Token((Token *)local_78);
  return true;
}

Assistant:

bool Scanner::scanStreamStart() {
  IsStartOfStream = false;

  EncodingInfo EI = getUnicodeEncoding(currentInput());

  Token T;
  T.Kind = Token::TK_StreamStart;
  T.Range = StringRef(Current, EI.second);
  TokenQueue.push_back(T);
  Current += EI.second;
  return true;
}